

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamHeaderValidator_p.cpp
# Opt level: O2

bool __thiscall
BamTools::Internal::SamHeaderValidator::CheckLengthInRange(SamHeaderValidator *this,string *length)

{
  bool bVar1;
  uint sequenceLength;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  stringstream lengthStream;
  
  if (length->_M_string_length == 0) {
    std::__cxx11::string::string
              ((string *)&lengthStream,"Sequence entry (@SQ) is missing LN tag",
               (allocator *)&local_1e8);
    AddError(this,(string *)&lengthStream);
    std::__cxx11::string::~string((string *)&lengthStream);
    bVar1 = false;
  }
  else {
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&lengthStream,(string *)length,_S_out|_S_in);
    std::istream::_M_extract<unsigned_int>((uint *)&lengthStream);
    bVar1 = sequenceLength - 1 < 0x1fffffff;
    if (!bVar1) {
      std::operator+(&local_1c8,"Sequence length (LN): ",length);
      std::operator+(&local_1e8,&local_1c8," out of range");
      AddError(this,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&lengthStream);
  }
  return bVar1;
}

Assistant:

bool SamHeaderValidator::CheckLengthInRange(const std::string& length)
{

    // invalid if empty
    if (length.empty()) {
        AddError("Sequence entry (@SQ) is missing LN tag");
        return false;
    }

    // convert string length to numeric
    std::stringstream lengthStream(length);
    unsigned int sequenceLength;
    lengthStream >> sequenceLength;

    // invalid if length outside accepted range
    if (sequenceLength < Constants::SAM_SQ_LENGTH_MIN ||
        sequenceLength > Constants::SAM_SQ_LENGTH_MAX) {
        AddError("Sequence length (LN): " + length + " out of range");
        return false;
    }

    // otherwise OK
    return true;
}